

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-target.c
# Opt level: O3

void adjust_panel_help(wchar_t y,wchar_t x,_Bool help,player *p,wchar_t mode,point_set **targets,
                      _Bool *show_interesting,int *target_index)

{
  int iVar1;
  term_conflict *t;
  loc *plVar2;
  ulong uVar3;
  int iVar4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  point_set *ppVar8;
  wchar_t wVar9;
  undefined7 in_register_00000011;
  byte bVar10;
  wchar_t wy;
  wchar_t wVar11;
  long lVar12;
  int iVar13;
  
  iVar7 = row_top_map[Term->sidebar_mode];
  iVar13 = Term->hgt + -2;
  if ((int)CONCAT71(in_register_00000011,help) == 0) {
    iVar13 = Term->hgt;
  }
  iVar1 = row_bottom_map[Term->sidebar_mode];
  lVar12 = 0;
  bVar10 = 0;
  do {
    t = (term_conflict *)angband_term[lVar12];
    if (t != (term_conflict *)0x0) {
      if (lVar12 == 0) {
        wVar9 = ~col_map[Term->sidebar_mode] + Term->wid;
        wVar11 = iVar13 - (iVar7 + iVar1);
      }
      else {
        if ((window_flag[lVar12] & 0x80) == 0) goto LAB_00208c0c;
        wVar9 = t->wid;
        wVar11 = t->hgt;
      }
      wy = t->offset_y;
      iVar6 = wVar9 / (int)(uint)tile_width;
      uVar3 = (long)wVar11 / (long)(int)(uint)tile_height;
      iVar4 = (int)uVar3;
      if (wy + iVar4 <= y) {
        do {
          wy = wy + ((int)(((uint)(uVar3 >> 0x1f) & 1) + iVar4) >> 1);
        } while (iVar4 + wy <= y);
      }
      wVar9 = t->offset_x;
      if (y < wy) {
        do {
          wy = wy - ((int)(((uint)(uVar3 >> 0x1f) & 1) + iVar4) >> 1);
        } while (y < wy);
      }
      if (wVar9 + iVar6 <= x) {
        do {
          wVar9 = wVar9 + iVar6 / 2;
        } while (iVar6 + wVar9 <= x);
      }
      if (x < wVar9) {
        do {
          wVar9 = wVar9 - iVar6 / 2;
        } while (x < wVar9);
      }
      _Var5 = modify_panel(t,wy,wVar9);
      bVar10 = bVar10 | _Var5;
    }
LAB_00208c0c:
    lVar12 = lVar12 + 1;
    if (lVar12 == 8) {
      if ((bVar10 != 0) && (handle_stuff(p), targets != (point_set **)0x0)) {
        point_set_dispose((point_set_conflict *)*targets);
        ppVar8 = target_get_monsters(mode,(monster_predicate)0x0,true);
        *targets = ppVar8;
      }
      if (target_index != (int *)0x0 && show_interesting != (_Bool *)0x0) {
        *show_interesting = false;
        iVar7 = point_set_size((point_set_conflict *)*targets);
        if (0 < iVar7) {
          lVar12 = 0;
          do {
            plVar2 = (*targets)->pts;
            if ((plVar2[lVar12].y == y) && (plVar2[lVar12].x == x)) {
              *target_index = (int)lVar12;
              *show_interesting = true;
              return;
            }
            lVar12 = lVar12 + 1;
            iVar7 = point_set_size((point_set_conflict *)*targets);
          } while (lVar12 < iVar7);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

static void adjust_panel_help(int y, int x, bool help,
		struct player *p, int mode, struct point_set **targets,
		bool *show_interesting, int *target_index)
{
	bool changed = false;

	int j;

	int screen_hgt_main = help ? (Term->hgt - ROW_MAP - ROW_BOTTOM_MAP - 2)
			 : (Term->hgt - ROW_MAP - ROW_BOTTOM_MAP);

	/* Scan windows */
	for (j = 0; j < ANGBAND_TERM_MAX; j++)
	{
		int wx, wy;
		int screen_hgt, screen_wid;

		term *t = angband_term[j];

		/* No window */
		if (!t) continue;

		/* No relevant flags */
		if ((j > 0) && !(window_flag[j] & PW_OVERHEAD)) continue;

		wy = t->offset_y;
		wx = t->offset_x;

		screen_hgt = (j == 0) ? screen_hgt_main : t->hgt;
		screen_wid = (j == 0) ? (Term->wid - COL_MAP - 1) : t->wid;

		/* Bigtile panels need adjustment */
		screen_wid = screen_wid / tile_width;
		screen_hgt = screen_hgt / tile_height;

		/* Adjust as needed */
		while (y >= wy + screen_hgt) wy += screen_hgt / 2;
		while (y < wy) wy -= screen_hgt / 2;

		/* Adjust as needed */
		while (x >= wx + screen_wid) wx += screen_wid / 2;
		while (x < wx) wx -= screen_wid / 2;

		/* Use "modify_panel" */
		if (modify_panel(t, wy, wx)) changed = true;
	}

	if (changed) {
		handle_stuff(p);
		if (targets) {
			/* Recalculate interesting grids */
			point_set_dispose(*targets);
			*targets = target_get_monsters(mode, NULL, true);
		}
	}

	if (show_interesting && target_index) {
		/* Turn interesting mode off if they clicked a boring spot... */
		*show_interesting = false;

		/* ...but turn it on if they clicked an interesting spot */
		for (j = 0; j < point_set_size(*targets); j++) {
			if (y == (*targets)->pts[j].y
					&& x == (*targets)->pts[j].x) {
				*target_index = j;
				*show_interesting = true;
				break;
			}
		}
	}
}